

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O0

Size __thiscall CGL::Vertex::degree(Vertex *this)

{
  bool bVar1;
  pointer pHVar2;
  pointer this_00;
  HalfedgeIter *pHVar3;
  long in_RDI;
  HalfedgeIter h;
  Size d;
  _Self local_18;
  Size local_10;
  
  local_10 = 0;
  local_18._M_node = *(_List_node_base **)(in_RDI + 0x130);
  do {
    pHVar2 = std::_List_iterator<CGL::Halfedge>::operator->
                       ((_List_iterator<CGL::Halfedge> *)0x134962);
    Halfedge::face(pHVar2);
    this_00 = std::_List_iterator<CGL::Face>::operator->((_List_iterator<CGL::Face> *)0x134972);
    bVar1 = Face::isBoundary(this_00);
    if (!bVar1) {
      local_10 = local_10 + 1;
    }
    pHVar2 = std::_List_iterator<CGL::Halfedge>::operator->
                       ((_List_iterator<CGL::Halfedge> *)0x134996);
    Halfedge::twin(pHVar2);
    pHVar2 = std::_List_iterator<CGL::Halfedge>::operator->
                       ((_List_iterator<CGL::Halfedge> *)0x1349a6);
    pHVar3 = Halfedge::next(pHVar2);
    local_18._M_node = pHVar3->_M_node;
    bVar1 = std::operator!=(&local_18,(_Self *)(in_RDI + 0x130));
  } while (bVar1);
  return local_10;
}

Assistant:

Size degree(void) const {
    Size d = 0;  // degree

    // iterate over halfedges incident on this vertex
    HalfedgeIter h = _halfedge;
    do {
      // don't count boundary loops
      if (!h->face()->isBoundary()) {
        d++;  // increment degree
      }

      // move to the next halfedge around the vertex
      h = h->twin()->next();
    } while (h != _halfedge);  // done iterating over halfedges

    return d;
  }